

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void pacf_burg(double *vec,int N,double *par,int M)

{
  double local_38;
  double var;
  double *temp;
  int i;
  int M_local;
  double *par_local;
  double *pdStack_10;
  int N_local;
  double *vec_local;
  
  temp._4_4_ = M;
  _i = par;
  par_local._4_4_ = N;
  pdStack_10 = vec;
  var = (double)malloc((long)M << 3);
  for (temp._0_4_ = 0; (int)temp < temp._4_4_; temp._0_4_ = (int)temp + 1) {
    burgalg(pdStack_10,par_local._4_4_ + -1,(int)temp + 1,(double *)var,&local_38);
    _i[(int)temp] = *(double *)((long)var + (long)(int)temp * 8);
  }
  free((void *)var);
  return;
}

Assistant:

void pacf_burg(double* vec, int N, double* par, int M) {
	int i;
	double *temp;
	double var;

	temp = (double*)malloc(sizeof(double)* M);
	for (i = 0; i < M; ++i) {
		burgalg(vec, N-1, i + 1, temp, &var);
		par[i] = temp[i];
	}
	free(temp);
}